

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O2

bitset<32UL>
jsoncons::decode_traits<std::bitset<32ul>,char,void>::
decode<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::allocator<char>>
          (basic_staj_cursor<char> *cursor,
          json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  uint uVar1;
  int iVar2;
  bitset<32UL> bVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ser_error *this;
  error_category *peVar4;
  undefined4 extraout_var_01;
  size_t sVar5;
  undefined4 extraout_var_02;
  size_t sVar6;
  error_code ec_00;
  error_code ec_01;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::reset(decoder);
  (*cursor->_vptr_basic_staj_cursor[6])(cursor,decoder,ec);
  if (ec->_M_value == 0) {
    if (decoder->is_valid_ != false) {
      json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
      ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                    *)&stack0xffffffffffffffc8);
      bVar3 = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<32UL>,_void>
              ::as((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                   &stack0xffffffffffffffc8);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 &stack0xffffffffffffffc8);
      return (bitset<32UL>)bVar3.super__Base_bitset<1UL>._M_w._M_w;
    }
    this = (ser_error *)__cxa_allocate_exception(0x58);
    peVar4 = conv_error_category();
    iVar2 = (*cursor->_vptr_basic_staj_cursor[9])(cursor);
    sVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x10))
                      ((long *)CONCAT44(extraout_var_01,iVar2));
    iVar2 = (*cursor->_vptr_basic_staj_cursor[9])(cursor);
    sVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar2) + 0x18))
                      ((long *)CONCAT44(extraout_var_02,iVar2));
    ec_01._M_cat = peVar4;
    ec_01._0_8_ = 1;
    ser_error::ser_error(this,ec_01,sVar5,sVar6);
  }
  else {
    this = (ser_error *)__cxa_allocate_exception(0x58);
    uVar1 = ec->_M_value;
    peVar4 = ec->_M_cat;
    iVar2 = (*cursor->_vptr_basic_staj_cursor[9])(cursor);
    sVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar2));
    iVar2 = (*cursor->_vptr_basic_staj_cursor[9])(cursor);
    sVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    ec_00._4_4_ = 0;
    ec_00._M_value = uVar1;
    ec_00._M_cat = peVar4;
    ser_error::ser_error(this,ec_00,sVar5,sVar6);
  }
  __cxa_throw(this,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            decoder.reset();
            cursor.read_to(decoder, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, cursor.context().line(), cursor.context().column()));
            }
            else if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(conv_errc::conversion_failed, cursor.context().line(), cursor.context().column()));
            }
            return decoder.get_result().template as<T>();
        }